

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O1

btScalar __thiscall btHingeConstraint::getParam(btHingeConstraint *this,int num,int axis)

{
  btScalar bVar1;
  
  bVar1 = 0.0;
  if ((axis == 5) || (axis == -1)) {
    switch(num) {
    case 1:
      bVar1 = this->m_normalERP;
      break;
    case 2:
      return this->m_stopERP;
    case 3:
      return this->m_normalCFM;
    case 4:
      return this->m_stopCFM;
    }
  }
  return bVar1;
}

Assistant:

btScalar btHingeConstraint::getParam(int num, int axis) const 
{
	btScalar retVal = 0;
	if((axis == -1) || (axis == 5))
	{
		switch(num)
		{	
			case BT_CONSTRAINT_STOP_ERP :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_ERP_STOP);
				retVal = m_stopERP;
				break;
			case BT_CONSTRAINT_STOP_CFM :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_CFM_STOP);
				retVal = m_stopCFM;
				break;
			case BT_CONSTRAINT_CFM :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_CFM_NORM);
				retVal = m_normalCFM;
				break;
			case BT_CONSTRAINT_ERP:
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_ERP_NORM);
				retVal = m_normalERP;
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else
	{
		btAssertConstrParams(0);
	}
	return retVal;
}